

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_segment.cpp
# Opt level: O0

void duckdb::TemplatedFetchRow<unsigned_char>
               (transaction_t start_time,transaction_t transaction_id,UpdateInfo *info,idx_t row_idx
               ,Vector *result,idx_t result_idx)

{
  anon_class_24_3_1deac13e *in_stack_00000008;
  transaction_t in_stack_00000010;
  transaction_t in_stack_00000018;
  uchar *result_data;
  
  FlatVector::GetData<unsigned_char>((Vector *)0xbbf8bc);
  UpdateInfo::
  UpdatesForTransaction<duckdb::TemplatedFetchRow<unsigned_char>(unsigned_long,unsigned_long,duckdb::UpdateInfo&,unsigned_long,duckdb::Vector&,unsigned_long)::_lambda(duckdb::UpdateInfo&)_1_>
            ((UpdateInfo *)result_data,in_stack_00000018,in_stack_00000010,in_stack_00000008);
  return;
}

Assistant:

static void TemplatedFetchRow(transaction_t start_time, transaction_t transaction_id, UpdateInfo &info, idx_t row_idx,
                              Vector &result, idx_t result_idx) {
	auto result_data = FlatVector::GetData<T>(result);
	UpdateInfo::UpdatesForTransaction(info, start_time, transaction_id, [&](UpdateInfo &current) {
		auto info_data = current.GetData<T>();
		auto tuples = current.GetTuples();
		// FIXME: we could do a binary search in here
		for (idx_t i = 0; i < current.N; i++) {
			if (tuples[i] == row_idx) {
				result_data[result_idx] = info_data[i];
				break;
			} else if (tuples[i] > row_idx) {
				break;
			}
		}
	});
}